

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

SquareMatrix<3> *
pbrt::WhiteBalance(SquareMatrix<3> *__return_storage_ptr__,Point2f srcWhite,Point2f targetWhite)

{
  Float *pFVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Float FVar6;
  int i_5;
  Float (*paFVar7) [3];
  int i_2;
  undefined4 *puVar8;
  int iVar9;
  long lVar10;
  uint *puVar11;
  int j;
  long lVar12;
  Float *pFVar13;
  Float (*paFVar14) [3];
  uint *puVar15;
  int k;
  long lVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  SquareMatrix<3> LMScorrect;
  SquareMatrix<3> r;
  
  auVar18._8_56_ = in_register_00001248;
  auVar18._0_8_ = targetWhite.super_Tuple2<pbrt::Point2,_float>;
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = srcWhite.super_Tuple2<pbrt::Point2,_float>;
  auVar26 = vmovshdup_avx(auVar17._0_16_);
  auVar27 = ZEXT816(0) << 0x40;
  auVar25 = ZEXT816(0) << 0x40;
  fVar22 = auVar26._0_4_;
  auVar28 = ZEXT816(0) << 0x40;
  auVar26 = ZEXT816(0) << 0x40;
  if ((fVar22 != 0.0) || (NAN(fVar22))) {
    auVar26._0_4_ = srcWhite.super_Tuple2<pbrt::Point2,_float>.x / fVar22;
    auVar26._4_12_ = auVar17._4_12_;
    auVar28 = ZEXT416((uint)(((1.0 - srcWhite.super_Tuple2<pbrt::Point2,_float>.x) - fVar22) /
                            fVar22));
    auVar26 = vblendps_avx(auVar26,_DAT_004541d0,0xe);
  }
  auVar24 = vmovshdup_avx(auVar18._0_16_);
  fVar22 = auVar24._0_4_;
  if ((fVar22 != 0.0) || (NAN(fVar22))) {
    auVar27._0_4_ = targetWhite.super_Tuple2<pbrt::Point2,_float>.x / fVar22;
    auVar27._4_12_ = auVar18._4_12_;
    auVar25 = ZEXT416((uint)(((1.0 - targetWhite.super_Tuple2<pbrt::Point2,_float>.x) - fVar22) /
                            fVar22));
    auVar27 = vblendps_avx(auVar27,_DAT_004541d0,0xe);
  }
  pFVar1 = LMScorrect.m[0] + 1;
  LMScorrect.m[0][0] = 0.0;
  LMScorrect.m[0][1] = 0.0;
  r.m[0][0] = 0.0;
  auVar24 = vmovshdup_avx(auVar26);
  puVar8 = &LMSFromXYZ;
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    pFVar13 = (Float *)&LMScorrect;
    if ((iVar9 != 0) && (pFVar13 = pFVar1, iVar9 != 1)) {
      pFVar13 = (Float *)&r;
    }
    *pFVar13 = 0.0;
    lVar12 = 0;
    do {
      auVar23 = auVar26;
      if (((int)lVar12 != 0) && (auVar23 = auVar24, (int)lVar12 != 1)) {
        auVar23 = auVar28;
      }
      pFVar13 = (Float *)&LMScorrect;
      if ((iVar9 != 0) && (pFVar13 = pFVar1, iVar9 != 1)) {
        pFVar13 = (Float *)&r;
      }
      auVar23 = vfmadd213ss_fma(auVar23,ZEXT416((uint)puVar8[lVar12]),ZEXT416((uint)*pFVar13));
      *pFVar13 = auVar23._0_4_;
      FVar6 = r.m[0][0];
      uVar4 = LMScorrect.m[0]._0_8_;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar10 != 3);
  pFVar1 = LMScorrect.m[0] + 1;
  auVar28._8_8_ = 0;
  auVar28._0_4_ = LMScorrect.m[0][0];
  auVar28._4_4_ = LMScorrect.m[0][1];
  LMScorrect.m[0][0] = 0.0;
  LMScorrect.m[0][1] = 0.0;
  r.m[0][0] = 0.0;
  auVar26 = vmovshdup_avx(auVar27);
  puVar8 = &LMSFromXYZ;
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    pFVar13 = (Float *)&LMScorrect;
    if ((iVar9 != 0) && (pFVar13 = pFVar1, iVar9 != 1)) {
      pFVar13 = (Float *)&r;
    }
    *pFVar13 = 0.0;
    lVar12 = 0;
    do {
      auVar24 = auVar27;
      if (((int)lVar12 != 0) && (auVar24 = auVar26, (int)lVar12 != 1)) {
        auVar24 = auVar25;
      }
      pFVar13 = (Float *)&LMScorrect;
      if ((iVar9 != 0) && (pFVar13 = pFVar1, iVar9 != 1)) {
        pFVar13 = (Float *)&r;
      }
      auVar24 = vfmadd213ss_fma(auVar24,ZEXT416((uint)puVar8[lVar12]),ZEXT416((uint)*pFVar13));
      *pFVar13 = auVar24._0_4_;
      uVar5 = LMScorrect.m[0]._0_8_;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar10 != 3);
  paFVar7 = (Float (*) [3])&LMScorrect;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = LMScorrect.m[0][0];
  auVar25._4_4_ = LMScorrect.m[0][1];
  auVar26 = vdivps_avx(auVar25,auVar28);
  auVar26 = vmovshdup_avx(auVar26);
  lVar10 = 0;
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar19._12_4_ = paFVar7[1][0];
    auVar19._16_4_ = paFVar7[1][1];
    auVar19._20_4_ = paFVar7[1][2];
    auVar19._24_4_ = paFVar7[2][0];
    auVar19._28_4_ = paFVar7[2][1];
    auVar19._32_4_ = paFVar7[2][2];
    auVar19._36_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][0];
    auVar19._40_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][1];
    auVar19._44_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][2];
    auVar19._48_4_ = paFVar7[4][0];
    auVar19._52_4_ = paFVar7[4][1];
    auVar19._56_4_ = paFVar7[4][2];
    auVar19._60_4_ = paFVar7[5][0];
    *(undefined1 (*) [64])paFVar7 = auVar19;
    lVar10 = lVar10 + 1;
    paFVar7 = paFVar7 + 1;
  } while (lVar10 != 3);
  LMScorrect.m[0][0] = (float)uVar5 / (float)uVar4;
  LMScorrect.m[1][1] = auVar26._0_4_;
  LMScorrect.m[2][2] = r.m[0][0] / FVar6;
  paFVar7 = (Float (*) [3])&r;
  lVar10 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar5 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar5,(char)uVar4));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar20._0_12_ = auVar19._0_12_;
    auVar20._12_4_ = paFVar7[1][0];
    auVar20._16_4_ = paFVar7[1][1];
    auVar20._20_4_ = paFVar7[1][2];
    auVar20._24_4_ = paFVar7[2][0];
    auVar20._28_4_ = paFVar7[2][1];
    auVar20._32_4_ = paFVar7[2][2];
    auVar20._36_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][0];
    auVar20._40_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][1];
    auVar20._44_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][2];
    auVar20._48_4_ = paFVar7[4][0];
    auVar20._52_4_ = paFVar7[4][1];
    auVar20._56_4_ = paFVar7[4][2];
    auVar20._60_4_ = paFVar7[5][0];
    *(undefined1 (*) [64])paFVar7 = auVar20;
    lVar10 = lVar10 + 1;
    paFVar7 = paFVar7 + 1;
  } while (lVar10 != 3);
  puVar8 = &XYZFromLMS;
  lVar10 = 0;
  do {
    lVar12 = 0;
    paFVar7 = (Float (*) [3])&LMScorrect;
    do {
      r.m[lVar10][lVar12] = 0.0;
      auVar26 = ZEXT816(0) << 0x40;
      lVar16 = 0;
      paFVar14 = paFVar7;
      do {
        auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)puVar8[lVar16]),
                                  ZEXT416((uint)(*(Float (*) [3])*paFVar14)[0]));
        lVar16 = lVar16 + 1;
        paFVar14 = paFVar14 + 1;
      } while (lVar16 != 3);
      r.m[lVar10][lVar12] = auVar26._0_4_;
      lVar12 = lVar12 + 1;
      paFVar7 = (Float (*) [3])(*paFVar7 + 1);
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar10 != 3);
  lVar10 = 0;
  paFVar7 = (Float (*) [3])__return_storage_ptr__;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar5 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar5,(char)uVar4));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar21._0_12_ = auVar19._0_12_;
    auVar21._12_4_ = paFVar7[1][0];
    auVar21._16_4_ = paFVar7[1][1];
    auVar21._20_4_ = paFVar7[1][2];
    auVar21._24_4_ = paFVar7[2][0];
    auVar21._28_4_ = paFVar7[2][1];
    auVar21._32_4_ = paFVar7[2][2];
    auVar21._36_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][0];
    auVar21._40_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][1];
    auVar21._44_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][2];
    auVar21._48_4_ = paFVar7[4][0];
    auVar21._52_4_ = paFVar7[4][1];
    auVar21._56_4_ = paFVar7[4][2];
    auVar21._60_4_ = paFVar7[5][0];
    *(undefined1 (*) [64])paFVar7 = auVar21;
    lVar10 = lVar10 + 1;
    paFVar7 = paFVar7 + 1;
  } while (lVar10 != 3);
  paFVar7 = (Float (*) [3])&r;
  lVar10 = 0;
  do {
    puVar11 = &LMSFromXYZ;
    lVar12 = 0;
    do {
      __return_storage_ptr__->m[lVar10][lVar12] = 0.0;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      lVar16 = 0;
      puVar15 = puVar11;
      do {
        auVar26 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416((uint)(*(Float (*) [3])*paFVar7)[lVar16]),
                                  ZEXT416(*puVar15));
        auVar17 = ZEXT1664(auVar26);
        lVar16 = lVar16 + 1;
        puVar15 = puVar15 + 3;
      } while (lVar16 != 3);
      __return_storage_ptr__->m[lVar10][lVar12] = auVar26._0_4_;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 1;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    paFVar7 = paFVar7 + 1;
  } while (lVar10 != 3);
  return __return_storage_ptr__;
}

Assistant:

inline SquareMatrix<3> WhiteBalance(Point2f srcWhite, Point2f targetWhite) {
    // Find LMS coefficients for source and target white
    XYZ srcXYZ = XYZ::FromxyY(srcWhite), dstXYZ = XYZ::FromxyY(targetWhite);
    auto srcLMS = LMSFromXYZ * srcXYZ, dstLMS = LMSFromXYZ * dstXYZ;

    // Return white balancing matrix for source and target white
    SquareMatrix<3> LMScorrect = SquareMatrix<3>::Diag(
        dstLMS[0] / srcLMS[0], dstLMS[1] / srcLMS[1], dstLMS[2] / srcLMS[2]);
    return XYZFromLMS * LMScorrect * LMSFromXYZ;
}